

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::ConvertEntropyToMnemonicRequest::ConvertEntropyToMnemonicRequest
          (ConvertEntropyToMnemonicRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ConvertEntropyToMnemonicRequest_00a866a0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->entropy_)._M_dataplus._M_p = (pointer)&(this->entropy_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->entropy_,"");
  (this->language_)._M_dataplus._M_p = (pointer)&(this->language_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->language_,"en","");
  CollectFieldName();
  return;
}

Assistant:

ConvertEntropyToMnemonicRequest() {
    CollectFieldName();
  }